

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::executor_function_view,asio::detail::executor_function_view>
               (executor_function_view *function,executor_function_view *context)

{
  executor_function_view *context_local;
  executor_function_view *function_local;
  
  asio::asio_handler_invoke<asio::detail::executor_function_view>(function,context);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_invoke hook is no longer used to invoke the function.
  (void)&error_if_hook_is_defined<Function, Context>;
  (void)context;
  function();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}